

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_replaceext(char *output,char *src,char *ext)

{
  char buffer [4096];
  char acStack_1018 [4104];
  
  stb__splitpath_raw(acStack_1018,src,3);
  if (ext == (char *)0x0) {
    strcpy(output,acStack_1018);
  }
  else {
    sprintf(output,"%s.%s",acStack_1018,ext + (*ext == '.'));
  }
  return output;
}

Assistant:

char *stb_replaceext(char *output, char *src, char *ext)
{
   char buffer[4096];
   stb_splitpath(buffer, src, STB_PATH | STB_FILE);
   if (ext)
      sprintf(output, "%s.%s", buffer, ext[0] == '.' ? ext+1 : ext);
   else
      strcpy(output, buffer);
   return output;
}